

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O1

uc_afl_ret __thiscall UCAFL::_fksrv_start(UCAFL *this)

{
  bool bVar1;
  bool bVar2;
  __pid_t _Var3;
  int iVar4;
  __pid_t __pid;
  afl_child_ret aVar5;
  ssize_t sVar6;
  char *pcVar7;
  uc_afl_ret uVar8;
  bool bVar9;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  int status_1;
  uint32_t status;
  pid_t child_pid;
  uint32_t was_killed;
  uchar tmp [4];
  int local_64;
  int local_60;
  __pid_t local_5c;
  int *local_58;
  int local_50 [2];
  int *local_48;
  __sighandler_t local_40;
  int *local_38;
  
  local_50[1] = 0;
  local_60 = 0;
  uVar8 = UC_AFL_RET_NO_AFL;
  if (this->has_afl_ == true) {
    if (this->afl_testcase_ptr_ != (uint32_t *)0x0) {
      local_60 = -0x7cffffff;
      sVar6 = write(199,&local_60,4);
      in_XMM0_Qa = extraout_XMM0_Qa;
      if (sVar6 != 4) {
        return UC_AFL_RET_NO_AFL;
      }
    }
    if ((this->afl_testcase_ptr_ == (uint32_t *)0x0) ||
       (pcVar7 = getenv("__AFL_SHM_FUZZ_ID"), in_XMM0_Qa = extraout_XMM0_Qa_00,
       pcVar7 == (char *)0x0)) {
      log(in_XMM0_Qa);
    }
    else {
      sVar6 = read(0xc6,&local_60,4);
      if ((sVar6 != 4) || (local_60 != -0x7effffff)) {
        log(__x);
        return UC_AFL_RET_ERROR;
      }
    }
    local_40 = signal(0x11,(__sighandler_t)0x0);
    local_58 = this->afl_child_pipe_;
    local_38 = this->afl_parent_pipe_;
    local_48 = this->afl_child_pipe_ + 1;
    bVar1 = true;
    aVar5 = AFL_CHILD_EXITED;
    __pid = local_5c;
    do {
      sVar6 = read(0xc6,local_50,4);
      if (sVar6 == 4) {
        if ((aVar5 == AFL_CHILD_EXITED) || (local_50[0] == 0)) {
LAB_001032c8:
          if (aVar5 == AFL_CHILD_EXITED) {
            if (*local_58 != 0) {
              close(*local_58);
              close(this->afl_parent_pipe_[1]);
            }
            iVar4 = pipe(local_58);
            if (iVar4 == 0) {
              iVar4 = pipe(local_38);
              if (iVar4 == 0) {
                __pid = fork();
                local_5c = __pid;
                if (-1 < __pid) {
                  if (__pid != 0) {
                    close(this->afl_child_pipe_[1]);
                    close(this->afl_parent_pipe_[0]);
                    goto LAB_00103359;
                  }
                  signal(0x11,local_40);
                  close(0xc6);
                  close(199);
                  close(this->afl_child_pipe_[0]);
                  close(this->afl_parent_pipe_[1]);
                  memset(this->afl_area_ptr_,0,0x10000);
                  bVar2 = false;
                  if (!bVar1) {
                    memset(this->afl_area_ptr_,0,0x10000);
                    bVar2 = bVar1;
                  }
                  this->afl_prev_loc_ = 0;
                  *this->afl_area_ptr_ = '\x01';
                  uVar8 = UC_AFL_RET_CHILD;
                  aVar5 = AFL_CHILD_EXITED;
                  bVar9 = false;
                  bVar1 = bVar2;
                  goto LAB_001033ae;
                }
                pcVar7 = "[!] Could not fork! ";
                goto LAB_001034f2;
              }
              _fksrv_start();
            }
            else {
              pcVar7 = "[!] Error creating pipe to child";
LAB_001034f2:
              perror(pcVar7);
            }
            uVar8 = UC_AFL_RET_ERROR;
            aVar5 = AFL_CHILD_EXITED;
            bVar9 = false;
          }
          else {
            sVar6 = write(this->afl_parent_pipe_[1],local_50 + 1,4);
            if (sVar6 == 4) {
LAB_00103359:
              sVar6 = write(199,&local_5c,4);
              if (sVar6 != 4) goto LAB_001033a5;
              aVar5 = _handle_child_requests(this);
              if (aVar5 == AFL_CHILD_EXITED) {
                _Var3 = waitpid(__pid,&local_64,0);
                if (_Var3 < 0) {
                  pcVar7 = "[!] The child\'s exit code could not be determined. ";
                  goto LAB_001034f2;
                }
              }
              else if (aVar5 == AFL_CHILD_FOUND_CRASH) {
                local_64 = this->wifsignaled_;
              }
              else if (aVar5 == AFL_CHILD_NEXT) {
                local_64 = 0;
              }
              sVar6 = write(199,&local_64,4);
              bVar9 = sVar6 == 4;
              if (!bVar9) {
                uVar8 = UC_AFL_RET_FINISHED;
              }
            }
            else {
              bVar9 = false;
              log(__x_02);
              uVar8 = UC_AFL_RET_ERROR;
            }
          }
        }
        else {
          log(__x_00);
          _Var3 = waitpid(__pid,&local_64,0);
          aVar5 = AFL_CHILD_EXITED;
          if (-1 < _Var3) goto LAB_001032c8;
          bVar9 = false;
          log(__x_01);
          uVar8 = UC_AFL_RET_ERROR;
          aVar5 = AFL_CHILD_EXITED;
        }
      }
      else {
LAB_001033a5:
        bVar9 = false;
        uVar8 = UC_AFL_RET_FINISHED;
      }
LAB_001033ae:
    } while (bVar9);
  }
  return uVar8;
}

Assistant:

uc_afl_ret _fksrv_start() {
        unsigned char tmp[4] = {0};
        pid_t child_pid;
        enum afl_child_ret child_ret = AFL_CHILD_EXITED;
        bool first_round = true;
        uint32_t status = 0;

        if (!this->has_afl_)
            return UC_AFL_RET_NO_AFL;

        if (this->afl_testcase_ptr_) {
            /* Parent supports testcases via shared map - and the user wants to
             * use it. Tell AFL. */
            status = (FS_OPT_ENABLED | FS_OPT_SHDMEM_FUZZ | FS_OPT_NEWCMPLOG);
            /* Phone home and tell the parent that we're OK. If parent isn't
               there, assume we're not running in forkserver mode and just
               execute program. */
            if (write(FORKSRV_FD + 1, &status, 4) != 4)
                return UC_AFL_RET_NO_AFL;
        }

        /* afl tells us in an extra message if it accepted this option or not */
        if (this->afl_testcase_ptr_ && getenv(SHM_FUZZ_ENV_VAR)) {
            if (read(FORKSRV_FD, &status, 4) != 4) {
                ERR("AFL parent exited before forkserver was up\n");
                return UC_AFL_RET_ERROR;
            }
            if (status != (FS_OPT_ENABLED | FS_OPT_SHDMEM_FUZZ)) {
                ERR("Unexpected response from AFL++ on forkserver setup\n");
                return UC_AFL_RET_ERROR;
            }
        } else {
            ERR("AFL++ sharedmap fuzzing not supported/SHM_FUZZ_ENV_VAR not "
                "set\n");
        }

        void (*old_sigchld_handler)(int) = signal(SIGCHLD, SIG_DFL);

        while (1) {

            uint32_t was_killed;
            int status;

            /* Wait for parent by reading from the pipe. Abort if read fails. */

            // See _uc_afl_next
            if (read(FORKSRV_FD, &was_killed, 4) != 4)
                return UC_AFL_RET_FINISHED;

            /* If we stopped the child in persistent mode, but there was a race
            condition and afl-fuzz already issued SIGKILL, write off the old
            process. */

            if ((child_ret != AFL_CHILD_EXITED) && was_killed) {

                ERR("Child was killed by AFL in the meantime.\n");

                child_ret = AFL_CHILD_EXITED;
                if (waitpid(child_pid, &status, 0) < 0) {
                    ERR("Error waiting for child!");
                    return UC_AFL_RET_ERROR;
                }
            }

            if (child_ret == AFL_CHILD_EXITED) {

                /* Child dead. Establish new a channel with child to grab
                   translation commands. We'll read from _R(afl_child_pipe),
                   child will write to _W(afl_child_pipe). */

                /* close the read fd of previous round. */

                if (_R(this->afl_child_pipe_)) {
                    close(_R(this->afl_child_pipe_));
                    close(_W(this->afl_parent_pipe_));
                }

                if (pipe(this->afl_child_pipe_)) {
                    perror("[!] Error creating pipe to child");
                    return UC_AFL_RET_ERROR;
                }
                if (pipe(this->afl_parent_pipe_)) {
                    perror("[!] Error creating pipe to parent");
                    close(_R(this->afl_child_pipe_));
                    close(_W(this->afl_child_pipe_));
                    return UC_AFL_RET_ERROR;
                }

                /* Create a clone of our process. */

                child_pid = fork();
                if (child_pid < 0) {
                    perror("[!] Could not fork! ");
                    return UC_AFL_RET_ERROR;
                }

                /* In child process: close fds, resume execution. */

                if (!child_pid) { // New child

                    signal(SIGCHLD, old_sigchld_handler);
                    // FORKSRV_FD is for communication with AFL, we don't need
                    // it in the child.
                    close(FORKSRV_FD);
                    close(FORKSRV_FD + 1);
                    close(_R(this->afl_child_pipe_));
                    close(_W(this->afl_parent_pipe_));

                    memset(this->afl_area_ptr_, 0, MAP_SIZE);
                    mem_barrier(); // Make very sure everything has been written
                                   // to the map at this point

                    if (!first_round) {

                        // For persistent mode: Clear the map manually after
                        // forks.
                        memset(this->afl_area_ptr_, 0, MAP_SIZE);

                    } else {

                        first_round = false;
                    }

                    this->afl_prev_loc_ = 0;
                    // Tell AFL we're alive
                    this->afl_area_ptr_[0] = 1;

                    return UC_AFL_RET_CHILD;

                } else { // parent for new child

                    /* If we don't close this in parent, we don't get notified
                     * on afl_child_pipe once child is gone. */

                    close(_W(this->afl_child_pipe_));
                    close(_R(this->afl_parent_pipe_));
                }

            } else { // parent, in persistent mode

                /* Special handling for persistent mode: if the child is alive
                   but currently stopped, simply restart it with a write to
                   afl_parent_pipe. In case we fuzz using shared map, use this
                   method to forward the size of the current testcase to the
                   child without cost. */

                // See _uc_afl_next
                if (write(_W(this->afl_parent_pipe_), tmp, 4) != 4) {

                    ERR("Child died when we tried to resume it\n");
                    return UC_AFL_RET_ERROR;
                }
            }

            /* In parent process: write PID to AFL. */

            if (write(FORKSRV_FD + 1, &child_pid, 4) != 4) {
                return UC_AFL_RET_FINISHED;
            }

            /* Collect translation requests until child finishes a run or dies
             */

            child_ret = this->_handle_child_requests();

            if (child_ret == AFL_CHILD_NEXT) {

                /* Child asks for next in persistent mode  */

                // This status tells AFL we are not crashed.
                status = 0;

            } else if (child_ret == AFL_CHILD_FOUND_CRASH) {

                /* WIFSIGNALED(wifsignaled) == 1 -> tells AFL the child crashed
                 * (even though it's still alive for persistent mode) */

                status = this->wifsignaled_;

            } else if (child_ret == AFL_CHILD_EXITED) {

                /* If child exited, get and relay exit status to parent through
                 * waitpid. */

                if (waitpid(child_pid, &status, 0) < 0) {

                    // Zombie Child could not be collected. Scary!
                    perror(
                        "[!] The child's exit code could not be determined. ");
                    return UC_AFL_RET_ERROR;
                }
            }

            /* Relay wait status to AFL pipe, then loop back. */

            if (write(FORKSRV_FD + 1, &status, 4) != 4)
                return UC_AFL_RET_FINISHED;
        }
    }